

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void * NULLC::AllocObject(int size,uint type)

{
  ulong *__s;
  uint *puVar1;
  uint uVar2;
  char *error;
  uint uVar3;
  Range range;
  Range local_30;
  
  if (size < 0) {
    error = "ERROR: requested memory size is less than zero";
  }
  else {
    uVar2 = size + 8;
    if (globalMemoryLimit < usedMemory + uVar2) {
      CollectMemory();
      if (globalMemoryLimit < usedMemory + uVar2) {
        error = "ERROR: reached global memory maximum";
        goto LAB_00229d3b;
      }
    }
    else if (collectableMinimum < usedMemory + uVar2) {
      CollectMemory();
    }
    if ((int)uVar2 < 0x41) {
      if ((int)uVar2 < 0x11) {
        if ((int)uVar2 < 9) {
          __s = (ulong *)ObjectBlockPool<8,_8192>::Alloc((ObjectBlockPool<8,_8192> *)pool8);
          uVar3 = 8;
        }
        else {
          __s = (ulong *)ObjectBlockPool<16,_4096>::Alloc((ObjectBlockPool<16,_4096> *)pool16);
          uVar3 = 0x10;
        }
      }
      else if ((int)uVar2 < 0x21) {
        __s = (ulong *)ObjectBlockPool<32,_2048>::Alloc((ObjectBlockPool<32,_2048> *)pool32);
        uVar3 = 0x20;
      }
      else {
        __s = (ulong *)ObjectBlockPool<64,_1024>::Alloc((ObjectBlockPool<64,_1024> *)pool64);
        uVar3 = 0x40;
      }
    }
    else if ((int)uVar2 < 0x101) {
      if ((int)uVar2 < 0x81) {
        __s = (ulong *)ObjectBlockPool<128,_512>::Alloc((ObjectBlockPool<128,_512> *)pool128);
        uVar3 = 0x80;
      }
      else {
        __s = (ulong *)ObjectBlockPool<256,_256>::Alloc((ObjectBlockPool<256,_256> *)pool256);
        uVar3 = 0x100;
      }
    }
    else if ((int)uVar2 < 0x201) {
      __s = (ulong *)ObjectBlockPool<512,_128>::Alloc((ObjectBlockPool<512,_128> *)pool512);
      uVar3 = 0x200;
    }
    else {
      puVar1 = (uint *)alignedAlloc(size,0xc);
      if (puVar1 == (uint *)0x0) {
        nullcThrowError("Allocation failed.");
        return (void *)0x0;
      }
      local_30.end = (void *)((long)puVar1 + (ulong)uVar2 + 4);
      local_30.start = puVar1;
      bigBlocks._24_8_ =
           Tree<NULLC::Range>::insert
                     ((Tree<NULLC::Range> *)bigBlocks,(node_type *)bigBlocks._24_8_,&local_30);
      *puVar1 = uVar2;
      __s = (ulong *)(puVar1 + 1);
      uVar3 = uVar2;
    }
    usedMemory = usedMemory + uVar3;
    if (__s != (ulong *)0x0) {
      if (type == 0) {
        uVar3 = 0;
      }
      else {
        if (*(uint *)(linker + 0x20c) <= type) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        uVar3 = (*(byte *)(*(long *)(linker + 0x200) + 0x15 + (ulong)type * 0x50) & 1) << 2;
      }
      memset(__s,0,(long)(int)uVar2);
      *__s = (ulong)(type << 8 | uVar3);
      return __s + 1;
    }
    error = "ERROR: allocation failed";
  }
LAB_00229d3b:
  nullcThrowError(error);
  return (void *)0x0;
}

Assistant:

void* NULLC::AllocObject(int size, unsigned type)
{
	if(size < 0)
	{
		nullcThrowError("ERROR: requested memory size is less than zero");
		return NULL;
	}

	void *data = NULL;
	size += sizeof(markerType);

	if((unsigned int)(usedMemory + size) > globalMemoryLimit)
	{
		CollectMemory();

		if((unsigned int)(usedMemory + size) > globalMemoryLimit)
		{
			nullcThrowError("ERROR: reached global memory maximum");
			return NULL;
		}
	}
	else if((unsigned int)(usedMemory + size) > collectableMinimum)
	{
		CollectMemory();
	}

	unsigned int realSize = size;
	if(size <= 64)
	{
		if(size <= 16)
		{
			if(size <= 8)
			{
				data = pool8.Alloc();
				realSize = 8;
			}else{
				data = pool16.Alloc();
				realSize = 16;
			}
		}else{
			if(size <= 32)
			{
				data = pool32.Alloc();
				realSize = 32;
			}else{
				data = pool64.Alloc();
				realSize = 64;
			}
		}
	}else{
		if(size <= 256)
		{
			if(size <= 128)
			{
				data = pool128.Alloc();
				realSize = 128;
			}else{
				data = pool256.Alloc();
				realSize = 256;
			}
		}else{
			if(size <= 512)
			{
				data = pool512.Alloc();
				realSize = 512;
			}else{
				void *ptr = NULLC::alignedAlloc(size - sizeof(markerType), 4 + sizeof(markerType));
				if(ptr == NULL)
				{
					nullcThrowError("Allocation failed.");
					return NULL;
				}

				Range range(ptr, (char*)ptr + size + 4);
				bigBlocks.insert(range);

				realSize = *(int*)ptr = size;
				data = (char*)ptr + 4;
			}
		}
	}
	usedMemory += realSize;

	if(data == NULL)
	{
		nullcThrowError("ERROR: allocation failed");
		return NULL;
	}
	int finalize = 0;
	if(type && (linker->exTypes[type].typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER))
		finalize = (int)OBJECT_FINALIZABLE;

	memset(data, 0, size);
	*(markerType*)data = finalize | (type << 8);
	return (char*)data + sizeof(markerType);
}